

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcServiceLife *in;
  
  in = (IfcServiceLife *)operator_new(0x130);
  *(undefined ***)&in->field_0x118 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x120 = 0;
  *(char **)&in->field_0x128 = "IfcServiceLife";
  Assimp::IFC::Schema_2x3::IfcControl::IfcControl
            ((IfcControl *)in,&PTR_construction_vtable_24__0089f1e0);
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined ***)in = &PTR__IfcServiceLife_0089f100;
  *(undefined ***)&in->field_0x118 = &PTR__IfcServiceLife_0089f1c8;
  *(undefined ***)&in->field_0x88 = &PTR__IfcServiceLife_0089f128;
  *(undefined ***)&in->field_0x98 = &PTR__IfcServiceLife_0089f150;
  *(undefined ***)&in->field_0xd0 = &PTR__IfcServiceLife_0089f178;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcServiceLife_0089f1a0;
  *(undefined1 **)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x10
       = &(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x20;
  *(undefined8 *)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x18
       = 0;
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcServiceLife,_2UL>).field_0x20 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcServiceLife>(db,params,in);
  return (Object *)(&in->field_0x0 + *(long *)(*(long *)in + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }